

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::protos::gen::TraceConfig_StatsdMetadata::TraceConfig_StatsdMetadata
          (TraceConfig_StatsdMetadata *this)

{
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__TraceConfig_StatsdMetadata_003a1c08;
  this->triggering_alert_id_ = 0;
  this->triggering_config_uid_ = 0;
  this->triggering_config_id_ = 0;
  this->triggering_subscription_id_ = 0;
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)&(this->unknown_fields_).field_2;
  (this->unknown_fields_)._M_string_length = 0;
  (this->unknown_fields_).field_2._M_local_buf[0] = '\0';
  (this->_has_field_).super__Base_bitset<1UL>._M_w = 0;
  return;
}

Assistant:

TraceConfig_StatsdMetadata::TraceConfig_StatsdMetadata() = default;